

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_doaddtemplate(t_symbol *templatesym,int *p_ntemplates,t_symbol ***p_templatevec)

{
  int iVar1;
  long lVar2;
  t_symbol **pptVar3;
  long lVar4;
  
  iVar1 = *p_ntemplates;
  lVar4 = (long)iVar1;
  if (0 < lVar4) {
    lVar2 = 0;
    do {
      if ((*p_templatevec)[lVar2] == templatesym) {
        return;
      }
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
  }
  pptVar3 = (t_symbol **)resizebytes(*p_templatevec,lVar4 * 8,lVar4 * 8 + 8);
  pptVar3[lVar4] = templatesym;
  *p_templatevec = pptVar3;
  *p_ntemplates = iVar1 + 1;
  return;
}

Assistant:

void canvas_doaddtemplate(t_symbol *templatesym,
    int *p_ntemplates, t_symbol ***p_templatevec)
{
    int n = *p_ntemplates, i;
    t_symbol **templatevec = *p_templatevec;
    for (i = 0; i < n; i++)
        if (templatevec[i] == templatesym)
            return;
    templatevec = (t_symbol **)t_resizebytes(templatevec,
        n * sizeof(*templatevec), (n+1) * sizeof(*templatevec));
    templatevec[n] = templatesym;
    *p_templatevec = templatevec;
    *p_ntemplates = n+1;
}